

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::OnIf(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = PopAndCheck1Type(this,I32,"if");
  RVar2 = PopAndCheckSignature(this,param_types,"if");
  PushLabel(this,If,param_types,result_types);
  PushTypes(this,param_types);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::OnIf(const TypeVector& param_types,
                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "if");
  result |= PopAndCheckSignature(param_types, "if");
  PushLabel(LabelType::If, param_types, result_types);
  PushTypes(param_types);
  return result;
}